

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O1

bool uWS::WebSocketProtocol<true,_uWS::WebSocketContext<false,_true>_>::consumeContinuation
               (char **src,uint *length,WebSocketState<true> *wState,void *user)

{
  char cVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  uint uVar5;
  bool bVar6;
  byte *pbVar7;
  uint uVar8;
  byte *pbVar9;
  bool bVar10;
  ulong uVar11;
  
  if (*length < wState->remainingBytes) {
    uVar8 = (*length & 0xfffffffc) + 4;
    if (uVar8 != 0) {
      pbVar7 = (byte *)*src;
      pbVar9 = pbVar7 + uVar8;
      do {
        *pbVar7 = *pbVar7 ^ wState->mask[0];
        pbVar7[1] = pbVar7[1] ^ wState->mask[1];
        pbVar7[2] = pbVar7[2] ^ wState->mask[2];
        pbVar7[3] = pbVar7[3] ^ wState->mask[3];
        pbVar7 = pbVar7 + 4;
      } while (pbVar7 < pbVar9);
    }
    uVar8 = wState->remainingBytes - *length;
    wState->remainingBytes = uVar8;
    bVar6 = WebSocketContext<false,_true>::handleFragment
                      (*src,(ulong)*length,uVar8,
                       (uint)(wState->state).opCode[(char)(*(byte *)&wState->state * '\x02') >> 6],
                       (bool)(*(byte *)&wState->state >> 7),wState,user);
    if ((!bVar6) && (uVar8 = *length, (uVar8 & 3) != 0)) {
      cVar1 = wState->mask[1];
      cVar2 = wState->mask[2];
      cVar3 = wState->mask[3];
      wState->mask[-uVar8 & 3] = wState->mask[0];
      wState->mask[1 - uVar8 & 3] = cVar1;
      wState->mask[(ulong)(-uVar8 & 3) ^ 2] = cVar2;
      wState->mask[~uVar8 & 3] = cVar3;
    }
    bVar10 = false;
  }
  else {
    uVar8 = wState->remainingBytes & 0xfffffffc;
    if (uVar8 != 0) {
      pbVar9 = (byte *)*src;
      pbVar7 = pbVar9 + uVar8;
      do {
        *pbVar9 = *pbVar9 ^ wState->mask[0];
        pbVar9[1] = pbVar9[1] ^ wState->mask[1];
        pbVar9[2] = pbVar9[2] ^ wState->mask[2];
        pbVar9[3] = pbVar9[3] ^ wState->mask[3];
        pbVar9 = pbVar9 + 4;
      } while (pbVar9 < pbVar7);
    }
    uVar5 = wState->remainingBytes;
    if ((uVar5 & 3) != 0) {
      uVar11 = 0;
      do {
        (*src)[uVar11 + (long)(int)uVar8] = (*src)[uVar11 + (long)(int)uVar8] ^ wState->mask[uVar11]
        ;
        uVar11 = uVar11 + 1;
      } while (((ulong)uVar5 & 3) != uVar11);
    }
    bVar10 = false;
    bVar6 = WebSocketContext<false,_true>::handleFragment
                      (*src,(ulong)wState->remainingBytes,0,
                       (uint)(wState->state).opCode[(char)(*(byte *)&wState->state * '\x02') >> 6],
                       (bool)(*(byte *)&wState->state >> 7),wState,user);
    if (!bVar6) {
      bVar4 = *(byte *)&wState->state;
      if ((char)bVar4 < '\0') {
        *(byte *)&wState->state = bVar4 & 0x9f | bVar4 + 0x60 & 0x60;
      }
      uVar8 = wState->remainingBytes;
      *src = *src + uVar8;
      *length = *length - uVar8;
      *(byte *)&wState->state = *(byte *)&wState->state | 1;
      bVar10 = true;
    }
  }
  return bVar10;
}

Assistant:

static inline bool consumeContinuation(char *&src, unsigned int &length, WebSocketState<isServer> *wState, void *user) {
        if (wState->remainingBytes <= length) {
            if (isServer) {
                int n = wState->remainingBytes >> 2;
                unmaskInplace(src, src + n * 4, wState->mask);
                for (int i = 0, s = wState->remainingBytes % 4; i < s; i++) {
                    src[n * 4 + i] ^= wState->mask[i];
                }
            }

            if (Impl::handleFragment(src, wState->remainingBytes, 0, wState->state.opCode[wState->state.opStack], wState->state.lastFin, wState, user)) {
                return false;
            }

            if (wState->state.lastFin) {
                wState->state.opStack--;
            }

            src += wState->remainingBytes;
            length -= wState->remainingBytes;
            wState->state.wantsHead = true;
            return true;
        } else {
            if (isServer) {
                unmaskInplace(src, src + ((length >> 2) + 1) * 4, wState->mask);
            }

            wState->remainingBytes -= length;
            if (Impl::handleFragment(src, length, wState->remainingBytes, wState->state.opCode[wState->state.opStack], wState->state.lastFin, wState, user)) {
                return false;
            }

            if (isServer && length % 4) {
                rotateMask(4 - (length % 4), wState->mask);
            }
            return false;
        }
    }